

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

char paranoid_yn(char *query,boolean paranoid)

{
  char cVar1;
  char buf [256];
  char query_yesno [512];
  
  if (paranoid != '\0') {
    sprintf(query_yesno,"%s [yes/no]",query);
    getlin(query_yesno,buf);
    lcase(buf);
    cVar1 = 'n';
    if (buf._0_4_ == 0x736579) {
      cVar1 = 'y';
    }
    return cVar1;
  }
  cVar1 = yn_function(query,"yn",'n');
  return cVar1;
}

Assistant:

char paranoid_yn(const char *query, boolean paranoid)
{
	if (paranoid) {
	    char buf[BUFSZ];
	    char query_yesno[2 * BUFSZ];
	    /* put [yes/no] between question and question mark? */
	    sprintf(query_yesno, "%s [yes/no]", query);
	    getlin(query_yesno, buf);
	    lcase(buf);
	    return !(strcmp (buf, "yes")) ? 'y' : 'n';
	} else
	    return yn(query);
}